

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ModuleHeaderSyntax *node;
  ExternModuleDeclSyntax *pEVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000078;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000080;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  Token *args_1;
  
  args_1 = (Token *)__child_stack;
  node = (ModuleHeaderSyntax *)
         deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000080,in_stack_00000078);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000080,in_stack_00000078);
  not_null<slang::syntax::ModuleHeaderSyntax_*>::operator*
            ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0x81a675);
  deepClone<slang::syntax::ModuleHeaderSyntax>(node,(BumpAllocator *)__child_stack);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ExternModuleDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ModuleHeaderSyntax&>
                     (unaff_retaddr,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      args_1,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,
                      TVar2._0_8_);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ExternModuleDeclSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ExternModuleDeclSyntax>(
        *deepClone(node.attributes, alloc),
        node.externKeyword.deepClone(alloc),
        *deepClone(node.actualAttributes, alloc),
        *deepClone<ModuleHeaderSyntax>(*node.header, alloc)
    );
}